

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O0

FiniteAutomaton *
Omega_h::FiniteAutomaton::make_deterministic
          (FiniteAutomaton *__return_storage_ptr__,FiniteAutomaton *nfa)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  type this;
  pointer ppVar7;
  reference piVar8;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar9;
  int nfa_token;
  int nfa_state;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  pointer psStack_200;
  int min_accepted;
  _Self local_1f8;
  set<int,_std::less<int>,_std::allocator<int>_> *local_1f0;
  _Self local_1e8;
  iterator it;
  undefined1 local_1d8 [4];
  int next_state;
  StateSet local_1a8;
  undefined4 local_174;
  undefined1 local_170 [8];
  StateSet next_ss;
  int symbol;
  set<int,_std::less<int>,_std::allocator<int>_> *ss;
  int state;
  int front;
  set<int,_std::less<int>,_std::allocator<int>_> local_120;
  StateSet local_f0;
  _Base_ptr local_c0;
  undefined1 local_b8;
  value_type_conflict1 local_ac;
  undefined1 local_a8 [8];
  StateSet start_ss;
  undefined1 local_60 [8];
  StateSetUniqPtrVector ssupv;
  StateSetPtr2State ssp2s;
  FiniteAutomaton *nfa_local;
  FiniteAutomaton *out;
  
  bVar1 = get_determinism(nfa);
  if (bVar1) {
    FiniteAutomaton(__return_storage_ptr__,nfa);
  }
  else {
    std::
    map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
    ::map((map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
           *)&ssupv.
              super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ::vector((vector<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
              *)local_60);
    iVar2 = get_nsymbols(nfa);
    FiniteAutomaton(__return_storage_ptr__,iVar2,true,0);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_a8);
    local_ac = 0;
    pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_a8,&local_ac);
    local_c0 = (_Base_ptr)pVar9.first._M_node;
    local_b8 = pVar9.second;
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              (&local_120,(set<int,_std::less<int>,_std::allocator<int>_> *)local_a8);
    get_epsilon_closure(&local_f0,&local_120,nfa);
    std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_a8,&local_f0);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_f0);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_120);
    emplace_back((StateSetUniqPtrVector *)local_60,
                 (set<int,_std::less<int>,_std::allocator<int>_> *)local_a8);
    iVar2 = add_state(__return_storage_ptr__);
    pvVar4 = std::
             vector<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
             ::back((vector<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                     *)local_60);
    _state = std::
             unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::get(pvVar4);
    pmVar5 = std::
             map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
             ::operator[]((map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
                           *)&ssupv.
                              super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)&state)
    ;
    *pmVar5 = iVar2;
    ss._4_4_ = 0;
    iVar2 = ss._4_4_;
    while (ss._4_4_ = iVar2,
          sVar6 = std::
                  vector<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                  ::size((vector<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                          *)local_60), ss._4_4_ < (int)sVar6) {
      pvVar4 = at<std::unique_ptr<std::set<int,std::less<int>,std::allocator<int>>,std::default_delete<std::set<int,std::less<int>,std::allocator<int>>>>>
                         ((vector<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                           *)local_60,ss._4_4_);
      this = std::
             unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::operator*(pvVar4);
      for (next_ss._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
          iVar2 = next_ss._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
          iVar3 = get_nsymbols(nfa), iVar2 < iVar3;
          next_ss._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
               next_ss._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
        step((StateSet *)local_170,this,
             next_ss._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,nfa);
        bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)local_170);
        if (bVar1) {
          local_174 = 6;
        }
        else {
          std::set<int,_std::less<int>,_std::allocator<int>_>::set
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1d8,
                     (set<int,_std::less<int>,_std::allocator<int>_> *)local_170);
          get_epsilon_closure(&local_1a8,(StateSet *)local_1d8,nfa);
          std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_170,&local_1a8);
          std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_1a8);
          std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1d8);
          local_1f0 = (set<int,_std::less<int>,_std::allocator<int>_> *)local_170;
          local_1e8._M_node =
               (_Base_ptr)
               std::
               map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
               ::find((map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
                       *)&ssupv.
                          super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1f0);
          local_1f8._M_node =
               (_Base_ptr)
               std::
               map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
               ::end((map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
                      *)&ssupv.
                         super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar1 = std::operator==(&local_1e8,&local_1f8);
          if (bVar1) {
            it._M_node._4_4_ = add_state(__return_storage_ptr__);
            emplace_back((StateSetUniqPtrVector *)local_60,(StateSet *)local_170);
            iVar2 = it._M_node._4_4_;
            pvVar4 = std::
                     vector<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                     ::back((vector<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                             *)local_60);
            psStack_200 = std::
                          unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          ::get(pvVar4);
            pmVar5 = std::
                     map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
                     ::operator[]((map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
                                   *)&ssupv.
                                      super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  &stack0xfffffffffffffe00);
            *pmVar5 = iVar2;
          }
          else {
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>
                     ::operator->(&local_1e8);
            it._M_node._4_4_ = ppVar7->second;
          }
          add_transition(__return_storage_ptr__,ss._4_4_,
                         next_ss._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                         it._M_node._4_4_);
          local_174 = 0;
        }
        std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)local_170);
      }
      __range2._4_4_ = -1;
      __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(this);
      _nfa_token = std::set<int,_std::less<int>,_std::allocator<int>_>::end(this);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&nfa_token), bVar1) {
        piVar8 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
        iVar2 = accepts(nfa,*piVar8);
        if ((iVar2 != -1) && ((__range2._4_4_ == -1 || (iVar2 < __range2._4_4_)))) {
          __range2._4_4_ = iVar2;
        }
        std::_Rb_tree_const_iterator<int>::operator++(&__end2);
      }
      iVar2 = ss._4_4_ + 1;
      if (__range2._4_4_ != -1) {
        add_accept(__return_storage_ptr__,ss._4_4_,__range2._4_4_);
      }
    }
    local_174 = 1;
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_a8);
    std::
    vector<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ::~vector((vector<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
               *)local_60);
    std::
    map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
    ::~map((map<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_int,_Omega_h::StateSetPtrLess,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>_*const,_int>_>_>
            *)&ssupv.
               super__Vector_base<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::default_delete<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

FiniteAutomaton FiniteAutomaton::make_deterministic(
    FiniteAutomaton const& nfa) {
  if (get_determinism(nfa)) return nfa;
  StateSetPtr2State ssp2s;
  StateSetUniqPtrVector ssupv;
  FiniteAutomaton out(get_nsymbols(nfa), true, 0);
  StateSet start_ss;
  start_ss.insert(0);
  start_ss = get_epsilon_closure(start_ss, nfa);
  emplace_back(ssupv, start_ss);
  ssp2s[ssupv.back().get()] = add_state(out);
  int front = 0;
  while (front < int(ssupv.size())) {
    auto state = front;
    auto& ss = *at(ssupv, front);
    ++front;
    for (int symbol = 0; symbol < get_nsymbols(nfa); ++symbol) {
      auto next_ss = Omega_h::step(ss, symbol, nfa);
      if (next_ss.empty()) continue;
      next_ss = get_epsilon_closure(next_ss, nfa);
      int next_state;
      auto it = ssp2s.find(&next_ss);
      if (it == ssp2s.end()) {
        next_state = add_state(out);
        emplace_back(ssupv, next_ss);
        ssp2s[ssupv.back().get()] = next_state;
      } else {
        next_state = it->second;
      }
      add_transition(out, state, symbol, next_state);
    }
    int min_accepted = -1;
    for (auto nfa_state : ss) {
      auto nfa_token = accepts(nfa, nfa_state);
      if (nfa_token == -1) continue;
      if (min_accepted == -1 || nfa_token < min_accepted) {
        min_accepted = nfa_token;
      }
    }
    if (min_accepted != -1) add_accept(out, state, min_accepted);
  }
  return out;
}